

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O0

long * permute(long *a,int c,long s)

{
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int i;
  long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (long *)0x0) {
    permute::source = permute::source + 1;
  }
  else {
    permute::set = in_RDI;
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      in_RDI[iVar1] = (long)iVar1;
    }
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      dss_random((long *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                 CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      permute::temp = in_RDI[permute::source];
      in_RDI[permute::source] = in_RDI[iVar1];
      in_RDI[iVar1] = permute::temp;
      permute::source = 0;
    }
  }
  if (in_ESI <= permute::source) {
    permute::source = permute::source - in_ESI;
  }
  return permute::set + permute::source;
}

Assistant:

long *
permute(long *a, int c, long s)
	{
    int i;
    static long source;
    static long *set, temp;
    
	if (a != (long *)NULL)
		{
		set = a;
		for (i=0; i < c; i++)
			*(a + i) = i;
		for (i=0; i < c; i++)
			{
			RANDOM(source, 0L, (long)(c - 1), s);
			temp = *(a + source);
			*(a + source) = *(a + i) ;
			*(a + i) = temp;
			source = 0;
			}
		}
	else
		source += 1;
	
	if (source >= c)
		source -= c;
	
	return(set + source);
	}